

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_all.cc
# Opt level: O2

int i2d_PKCS8PrivateKeyInfo_bio(BIO *bp,EVP_PKEY *key)

{
  int iVar1;
  PKCS8_PRIV_KEY_INFO *p8inf;
  
  p8inf = EVP_PKEY2PKCS8(key);
  if (p8inf == (PKCS8_PRIV_KEY_INFO *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = i2d_PKCS8_PRIV_KEY_INFO_bio(bp,p8inf);
    PKCS8_PRIV_KEY_INFO_free(p8inf);
  }
  return iVar1;
}

Assistant:

int i2d_PKCS8PrivateKeyInfo_bio(BIO *bp, EVP_PKEY *key) {
  PKCS8_PRIV_KEY_INFO *p8inf;
  int ret;
  p8inf = EVP_PKEY2PKCS8(key);
  if (!p8inf) {
    return 0;
  }
  ret = i2d_PKCS8_PRIV_KEY_INFO_bio(bp, p8inf);
  PKCS8_PRIV_KEY_INFO_free(p8inf);
  return ret;
}